

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BinaryBinsSelectExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BinaryBinsSelectExpr,slang::ast::BinsSelectExpr_const&,slang::ast::BinsSelectExpr_const&,slang::ast::BinaryBinsSelectExpr::Op&>
          (BumpAllocator *this,BinsSelectExpr *args,BinsSelectExpr *args_1,Op *args_2)

{
  Op OVar1;
  BinaryBinsSelectExpr *pBVar2;
  
  pBVar2 = (BinaryBinsSelectExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinaryBinsSelectExpr *)this->endPtr < pBVar2 + 1) {
    pBVar2 = (BinaryBinsSelectExpr *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pBVar2 + 1);
  }
  OVar1 = *args_2;
  (pBVar2->super_BinsSelectExpr).kind = Binary;
  (pBVar2->super_BinsSelectExpr).syntax = (SyntaxNode *)0x0;
  pBVar2->left = args;
  pBVar2->right = args_1;
  pBVar2->op = OVar1;
  return pBVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }